

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

undefined8 to_str_abi_cxx11_(uchar c)

{
  int iVar1;
  ostream *poVar2;
  byte in_SIL;
  undefined7 in_register_00000039;
  ostringstream local_190 [8];
  ostringstream strm;
  uchar c_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar1 = isprint((uint)in_SIL);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)local_190,'<');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)in_SIL);
    std::operator<<(poVar2,'>');
  }
  else {
    std::operator<<((ostream *)local_190,in_SIL);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return CONCAT71(in_register_00000039,c);
}

Assistant:

static std::string to_str(unsigned char c)
{
	std::ostringstream strm;
	if (isprint(c)) strm << c;
	else            strm << '<' << int(c) << '>';
	return strm.str();
}